

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_2::PolygonOffsetUnitsCase::test(PolygonOffsetUnitsCase *this)

{
  CallLogWrapper *this_00;
  GLfloat units;
  int iVar1;
  long lVar2;
  float fVar3;
  Random rnd;
  deRandom local_38;
  
  deRandom_init(&local_38,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (0,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x2a00);
  lVar2 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  do {
    units = *(GLfloat *)((long)&DAT_01c0ed30 + lVar2);
    glu::CallLogWrapper::glPolygonOffset(this_00,0.0,units);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (units,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x2a00);
    ApiCase::expectError(&this->super_ApiCase,0);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  iVar1 = 0x78;
  do {
    fVar3 = deRandom_getFloat(&local_38);
    fVar3 = fVar3 * 128000.0 + -64000.0;
    glu::CallLogWrapper::glPolygonOffset(this_00,0.0,fVar3);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (fVar3,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x2a00);
    ApiCase::expectError(&this->super_ApiCase,0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloat(m_testCtx, GL_POLYGON_OFFSET_UNITS, 0.0f);
		expectError(GL_NO_ERROR);

		const float fixedTests[] =
		{
			0.0f, 0.5f, -0.5f, 1.5f
		};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fixedTests); ++ndx)
		{
			glPolygonOffset(0, fixedTests[ndx]);
			m_verifier->verifyFloat(m_testCtx, GL_POLYGON_OFFSET_UNITS, fixedTests[ndx]);
			expectError(GL_NO_ERROR);
		}

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat reference = rnd.getFloat(-64000, 64000);

			glPolygonOffset(0, reference);
			m_verifier->verifyFloat(m_testCtx, GL_POLYGON_OFFSET_UNITS, reference);
			expectError(GL_NO_ERROR);
		}
	}